

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToZip
          (GeneratorContextImpl *this,string *filename)

{
  pointer *this_00;
  byte bVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  ostream *poVar5;
  pointer filename_00;
  pointer ppVar6;
  bool bVar7;
  iterator local_c8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_c0;
  iterator local_b8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_b0;
  const_iterator iter;
  undefined1 local_98 [8];
  ZipWriter zip_writer;
  FileOutputStream stream;
  int error;
  int file_descriptor;
  string *filename_local;
  GeneratorContextImpl *this_local;
  
  if ((this->had_error_ & 1U) == 0) {
    do {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = open(pcVar3,0x241,0x1b6);
      bVar7 = false;
      if (iVar2 < 0) {
        piVar4 = __errno_location();
        bVar7 = *piVar4 == 4;
      }
    } while (bVar7);
    if (iVar2 < 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)filename);
      poVar5 = std::operator<<(poVar5,": ");
      pcVar3 = strerror(iVar2);
      std::operator<<(poVar5,pcVar3);
      this_local._7_1_ = false;
    }
    else {
      this_00 = &zip_writer.files_.
                 super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      google::protobuf::io::FileOutputStream::FileOutputStream((FileOutputStream *)this_00,iVar2,-1)
      ;
      ZipWriter::ZipWriter((ZipWriter *)local_98,(ZeroCopyOutputStream *)this_00);
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           ::begin(&this->files_);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ::_Rb_tree_const_iterator(&local_b0,&local_b8);
      while( true ) {
        local_c8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
             ::end(&this->files_);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        ::_Rb_tree_const_iterator(&local_c0,&local_c8);
        bVar7 = std::operator!=(&local_b0,&local_c0);
        if (!bVar7) break;
        filename_00 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                      ::operator->(&local_b0);
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 ::operator->(&local_b0);
        ZipWriter::Write((ZipWriter *)local_98,&filename_00->first,ppVar6->second);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        ::operator++(&local_b0);
      }
      ZipWriter::WriteDirectory((ZipWriter *)local_98);
      iVar2 = io::FileOutputStream::GetErrno
                        ((FileOutputStream *)
                         &zip_writer.files_.
                          super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (iVar2 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)filename);
        poVar5 = std::operator<<(poVar5,": ");
        iVar2 = io::FileOutputStream::GetErrno
                          ((FileOutputStream *)
                           &zip_writer.files_.
                            super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar3 = strerror(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = google::protobuf::io::FileOutputStream::Close();
      if ((bVar1 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)filename);
        poVar5 = std::operator<<(poVar5,": ");
        iVar2 = io::FileOutputStream::GetErrno
                          ((FileOutputStream *)
                           &zip_writer.files_.
                            super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar3 = strerror(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      this_local._7_1_ = true;
      ZipWriter::~ZipWriter((ZipWriter *)local_98);
      google::protobuf::io::FileOutputStream::~FileOutputStream
                ((FileOutputStream *)
                 &zip_writer.files_.
                  super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToZip(
    const string& filename) {
  if (had_error_) {
    return false;
  }

  // Create the output file.
  int file_descriptor;
  do {
    file_descriptor =
      open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (file_descriptor < 0 && errno == EINTR);

  if (file_descriptor < 0) {
    int error = errno;
    cerr << filename << ": " << strerror(error);
    return false;
  }

  // Create the ZipWriter
  io::FileOutputStream stream(file_descriptor);
  ZipWriter zip_writer(&stream);

  for (map<string, string*>::const_iterator iter = files_.begin();
       iter != files_.end(); ++iter) {
    zip_writer.Write(iter->first, *iter->second);
  }

  zip_writer.WriteDirectory();

  if (stream.GetErrno() != 0) {
    cerr << filename << ": " << strerror(stream.GetErrno()) << endl;
  }

  if (!stream.Close()) {
    cerr << filename << ": " << strerror(stream.GetErrno()) << endl;
  }

  return true;
}